

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha_filename.c
# Opt level: O1

void test_read_format_lha_filename(void)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  char *pcVar4;
  archive *paVar5;
  archive_conflict *paVar6;
  la_int64_t lVar7;
  archive_entry *ae;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_lha_filename_cp932.lzh");
  pcVar4 = setlocale(6,"ja_JP.eucJP");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                   ,L'\'');
    pcVar4 = "ja_JP.eucJP locale not available on this system.";
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                     ,L'1',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                        ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar5
                       );
    iVar1 = archive_read_set_options(paVar5,"hdrcharset=CP932");
    iVar2 = archive_read_free(paVar5);
    if (iVar1 == 0) {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'9',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
      paVar6 = (archive_conflict *)archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                       ,L';',(uint)(paVar6 != (archive_conflict *)0x0),
                       "(a = archive_read_new()) != NULL",(void *)0x0);
      iVar1 = archive_read_support_filter_all((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar6);
      iVar1 = archive_read_support_format_all((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar6);
      wVar3 = archive_read_open_filename(paVar6,"test_read_format_lha_filename_cp932.lzh",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'?',0,"ARCHIVE_OK",(long)wVar3,
                          "archive_read_open_filename(a, refname, 10240)",paVar6);
      iVar1 = archive_read_next_header((archive *)paVar6,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar6
                         );
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                 ,L'D',anon_var_dwarf_6a1a0 + 7,"\"\\xB4\\xC1\\xBB\\xFA\\x2E\\x74\\x78\\x74\"",
                 pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar7 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'E',8,"8",lVar7,"archive_entry_size(ae)",(void *)0x0);
      wVar3 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'F',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'G',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar6);
      iVar1 = archive_read_next_header((archive *)paVar6,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar6
                         );
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                 ,L'K',anon_var_dwarf_6a25a + 0xb,"\"\\xC9\\xBD\\x2E\\x74\\x78\\x74\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar7 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'L',4,"4",lVar7,"archive_entry_size(ae)",(void *)0x0);
      wVar3 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'M',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'N',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar6);
      iVar1 = archive_read_next_header((archive *)paVar6,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'Q',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar6);
      iVar1 = archive_filter_code((archive *)paVar6,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'T',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar6);
      iVar1 = archive_format((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'U',0xb0000,"ARCHIVE_FORMAT_LHA",(long)iVar1,"archive_format(a)",paVar6)
      ;
      iVar1 = archive_read_close((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
      iVar1 = archive_read_free((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      goto LAB_0017aa14;
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                        ,L'4',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                   ,L'5');
    pcVar4 = "This system cannot convert character-set from CP932 to eucJP.";
  }
  test_skipping(pcVar4);
LAB_0017aa14:
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                   ,L'f');
    pcVar4 = "en_US.UTF-8 locale not available on this system.";
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                     ,L'o',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                        ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar5
                       );
    iVar1 = archive_read_set_options(paVar5,"hdrcharset=CP932");
    iVar2 = archive_read_free(paVar5);
    if (iVar1 == 0) {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'w',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
      paVar6 = (archive_conflict *)archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                       ,L'y',(uint)(paVar6 != (archive_conflict *)0x0),
                       "(a = archive_read_new()) != NULL",(void *)0x0);
      iVar1 = archive_read_support_filter_all((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar6);
      iVar1 = archive_read_support_format_all((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar6);
      wVar3 = archive_read_open_filename(paVar6,"test_read_format_lha_filename_cp932.lzh",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'}',0,"ARCHIVE_OK",(long)wVar3,
                          "archive_read_open_filename(a, refname, 10240)",paVar6);
      iVar1 = archive_read_next_header((archive *)paVar6,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x80',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar6);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                 ,L'\x82',anon_var_dwarf_90ea7 + 0x36,
                 "\"\\xE6\\xBC\\xA2\\xE5\\xAD\\x97\\x2E\\x74\\x78\\x74\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar7 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x83',8,"8",lVar7,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)paVar6,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar6);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                 ,L'\x88',anon_var_dwarf_6a346 + 0x10,"\"\\xE8\\xA1\\xA8\\x2E\\x74\\x78\\x74\"",
                 pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar7 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x89',4,"4",lVar7,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)paVar6,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x8d',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar6);
      iVar1 = archive_filter_code((archive *)paVar6,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x90',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar6);
      iVar1 = archive_format((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x91',0xb0000,"ARCHIVE_FORMAT_LHA",(long)iVar1,"archive_format(a)",
                          paVar6);
      iVar1 = archive_read_close((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
      iVar1 = archive_read_free((archive *)paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                          ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      return;
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                        ,L'r',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_lha_filename.c"
                   ,L's');
    pcVar4 = "This system cannot convert character-set from CP932 to UTF-8.";
  }
  test_skipping(pcVar4);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_lha_filename)
{
	/* A sample file was created with LHA32.EXE through UNLHA.DLL. */
	const char *refname = "test_read_format_lha_filename_cp932.lzh";

	extract_reference_file(refname);

	test_read_format_lha_filename_CP932_eucJP(refname);
	test_read_format_lha_filename_CP932_UTF8(refname);
	test_read_format_lha_filename_CP932_Windows(refname);
}